

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

bool __thiscall
Memory::HeapInfo::IsPageHeapEnabledForBlock<SmallAllocationBlockAttributes>
          (HeapInfo *this,size_t objectSize)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  undefined8 *in_FS_OFFSET;
  
  if (this->isPageHeapEnabled == true) {
    if ((objectSize == 0) || (0x300 < objectSize || (objectSize & 0xf) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                         ,0xc4,"(IsAlignedSmallObjectSize(sizeCat))",
                         "IsAlignedSmallObjectSize(sizeCat)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    BVar4 = BVStatic<48UL>::Test(&this->smallBlockPageHeapBucketFilter,(int)(objectSize >> 4) - 1);
    bVar3 = BVar4 != '\0';
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool HeapInfo::IsPageHeapEnabledForBlock(const size_t objectSize)
{
    if (IsPageHeapEnabled())
    {
        if (TBlockAttributes::IsSmallBlock)
        {
            return smallBlockPageHeapBucketFilter.Test(GetBucketIndex(objectSize)) != 0;
        }
        else if (TBlockAttributes::IsMediumBlock)
        {
            return mediumBlockPageHeapBucketFilter.Test(GetMediumBucketIndex(objectSize)) != 0;
        }
        else
        {
            return ((byte)this->pageHeapBlockType & (byte)PageHeapBlockTypeFilter::PageHeapBlockTypeFilterLarge) != 0;
        }
    }
    return false;
}